

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialManager.cpp
# Opt level: O0

Poly * __thiscall MT32Emu::PartialManager::assignPolyToPart(PartialManager *this,Part *part)

{
  uint uVar1;
  Bit32u BVar2;
  Poly *poly;
  Part *part_local;
  PartialManager *this_local;
  
  uVar1 = this->firstFreePolyIndex;
  BVar2 = Synth::getPartialCount(this->synth);
  if (uVar1 < BVar2) {
    this_local = (PartialManager *)this->freePolys[this->firstFreePolyIndex];
    this->freePolys[this->firstFreePolyIndex] = (Poly *)0x0;
    this->firstFreePolyIndex = this->firstFreePolyIndex + 1;
    Poly::setPart((Poly *)this_local,part);
  }
  else {
    this_local = (PartialManager *)0x0;
  }
  return (Poly *)this_local;
}

Assistant:

Poly *PartialManager::assignPolyToPart(Part *part) {
	if (firstFreePolyIndex < synth->getPartialCount()) {
		Poly *poly = freePolys[firstFreePolyIndex];
		freePolys[firstFreePolyIndex] = NULL;
		firstFreePolyIndex++;
		poly->setPart(part);
		return poly;
	}
	return NULL;
}